

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  u8 uVar2;
  char cVar3;
  bool bVar4;
  Vdbe *pVVar5;
  size_t __n;
  int iVar6;
  int iVar7;
  char *z2;
  char **ppcVar8;
  char *pcVar9;
  uchar *puVar10;
  Mem *pMVar11;
  char *pcVar12;
  char **ppcVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  Vdbe *local_80;
  int local_74;
  sqlite3 *local_70;
  char *local_68;
  char **local_60;
  sqlite3_callback local_58;
  char **local_50;
  void *local_48;
  size_t local_40;
  ulong local_38;
  
  local_80 = (Vdbe *)0x0;
  local_58 = xCallback;
  local_48 = pArg;
  iVar6 = sqlite3SafetyCheckOk(db);
  if (iVar6 == 0) {
    iVar6 = 0x15;
    sqlite3_log(0x15,"misuse at line %d of [%.10s]",0x16799,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
  }
  else {
    pcVar12 = "";
    if (zSql != (char *)0x0) {
      pcVar12 = zSql;
    }
    local_50 = pzErrMsg;
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    sqlite3Error(db,0,(char *)0x0);
    ppcVar8 = (char **)0x0;
    local_70 = db;
    do {
      if (*pcVar12 == '\0') {
        iVar6 = 0;
        break;
      }
      local_80 = (Vdbe *)0x0;
      iVar6 = sqlite3LockAndPrepare
                        (db,pcVar12,-1,1,(Vdbe *)0x0,(sqlite3_stmt **)&local_80,&local_68);
      iVar7 = 2;
      if (iVar6 == 0) {
        if (local_80 == (Vdbe *)0x0) {
          iVar6 = 0;
          pcVar12 = local_68;
        }
        else {
          uVar16 = (ulong)local_80->nResColumn;
          local_40 = (ulong)local_80->nResColumn * 0x10 + 1;
          bVar4 = false;
          ppcVar13 = (char **)0x0;
          local_38 = uVar16;
          do {
            iVar6 = sqlite3_step((sqlite3_stmt *)local_80);
            __n = local_40;
            if (local_58 == (sqlite3_callback)0x0) {
LAB_00123f0e:
              if (iVar6 == 100) {
                iVar7 = 0;
                iVar6 = 100;
              }
              else {
                iVar6 = sqlite3VdbeFinalize(local_80);
                local_80 = (Vdbe *)0x0;
                pcVar12 = local_68 + -1;
                do {
                  pbVar1 = (byte *)(pcVar12 + 1);
                  pcVar12 = pcVar12 + 1;
                } while ((""[*pbVar1] & 1) != 0);
                iVar7 = 5;
              }
            }
            else {
              if (iVar6 != 100) {
                if (iVar6 == 0x65 && !bVar4) {
                  if ((local_70->flags & 0x20) != 0) goto LAB_00123dc1;
                  bVar4 = false;
                }
                goto LAB_00123f0e;
              }
LAB_00123dc1:
              local_74 = iVar6;
              local_60 = ppcVar13;
              if (bVar4) {
LAB_00123e26:
                ppcVar13 = local_60;
                if ((local_74 == 100) && (ppcVar13 = ppcVar8 + uVar16, uVar16 != 0)) {
                  uVar15 = 0;
                  do {
                    puVar10 = sqlite3_column_text((sqlite3_stmt *)local_80,(int)uVar15);
                    pVVar5 = local_80;
                    ppcVar13[uVar15] = (char *)puVar10;
                    if (puVar10 == (uchar *)0x0) {
                      pMVar11 = columnMem((sqlite3_stmt *)local_80,(int)uVar15);
                      uVar2 = pMVar11->type;
                      columnMallocFailure((sqlite3_stmt *)pVVar5);
                      uVar16 = local_38;
                      if (uVar2 != '\x05') {
                        local_70->mallocFailed = '\x01';
                        iVar7 = 6;
                        bVar4 = true;
                        iVar6 = 100;
                        goto LAB_00123f4a;
                      }
                    }
                    uVar15 = uVar15 + 1;
                  } while (uVar16 != uVar15);
                }
                iVar6 = (*local_58)(local_48,(int)uVar16,ppcVar13,ppcVar8);
                if (iVar6 == 0) {
                  bVar4 = true;
                  iVar6 = local_74;
                  goto LAB_00123f0e;
                }
                sqlite3VdbeFinalize(local_80);
                local_80 = (Vdbe *)0x0;
                sqlite3Error(local_70,4,(char *)0x0);
                iVar7 = 6;
                bVar4 = true;
                iVar6 = 4;
              }
              else {
                ppcVar8 = (char **)sqlite3DbMallocRaw(local_70,(int)local_40);
                if (ppcVar8 != (char **)0x0) {
                  memset(ppcVar8,0,__n);
                  pVVar5 = local_80;
                  if (uVar16 != 0) {
                    uVar15 = 0;
                    do {
                      pcVar9 = sqlite3_column_name((sqlite3_stmt *)pVVar5,(int)uVar15);
                      ppcVar8[uVar15] = pcVar9;
                      uVar15 = uVar15 + 1;
                    } while (uVar16 != uVar15);
                  }
                  goto LAB_00123e26;
                }
                iVar7 = 6;
                ppcVar8 = (char **)0x0;
                bVar4 = false;
                ppcVar13 = local_60;
                iVar6 = local_74;
              }
            }
LAB_00123f4a:
            db = local_70;
          } while (iVar7 == 0);
          if (iVar7 == 5) {
            sqlite3DbFree(local_70,ppcVar8);
            ppcVar8 = (char **)0x0;
            iVar7 = 0;
          }
        }
      }
      if ((iVar7 != 0) && (iVar7 != 2)) {
        if (iVar7 != 6) {
          return (int)&local_68;
        }
        break;
      }
    } while (iVar6 == 0);
    if (local_80 != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_80);
    }
    sqlite3DbFree(db,ppcVar8);
    iVar6 = sqlite3ApiExit(db,iVar6);
    ppcVar8 = local_50;
    if (((iVar6 == 0) || (iVar7 = sqlite3_errcode(db), ppcVar8 == (char **)0x0)) || (iVar6 != iVar7)
       ) {
      if (ppcVar8 != (char **)0x0) {
        *ppcVar8 = (char *)0x0;
      }
    }
    else {
      pcVar12 = sqlite3_errmsg(db);
      if (pcVar12 == (char *)0x0) {
        uVar14 = 1;
      }
      else {
        uVar14 = 0xffffffff;
        do {
          uVar14 = uVar14 + 1;
          cVar3 = *pcVar12;
          pcVar12 = pcVar12 + 1;
        } while (cVar3 != '\0');
        uVar14 = (uVar14 & 0x3fffffff) + 1;
      }
      pcVar12 = (char *)sqlite3Malloc(uVar14);
      *ppcVar8 = pcVar12;
      if (pcVar12 == (char *)0x0) {
        iVar6 = 7;
        sqlite3Error(db,7,(char *)0x0);
      }
      else {
        pcVar9 = sqlite3_errmsg(db);
        memcpy(pcVar12,pcVar9,(ulong)uVar14);
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar6;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK, 0);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }

    callbackIsInit = 0;
    nCol = sqlite3_column_count(pStmt);

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc || 
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          azCols = sqlite3DbMallocZero(db, 2*nCol*sizeof(const char*) + 1);
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              db->mallocFailed = 1;
              goto exec_out;
            }
          }
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT, 0);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && ALWAYS(rc==sqlite3_errcode(db)) && pzErrMsg ){
    int nErrMsg = 1 + sqlite3Strlen30(sqlite3_errmsg(db));
    *pzErrMsg = sqlite3Malloc(nErrMsg);
    if( *pzErrMsg ){
      memcpy(*pzErrMsg, sqlite3_errmsg(db), nErrMsg);
    }else{
      rc = SQLITE_NOMEM;
      sqlite3Error(db, SQLITE_NOMEM, 0);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}